

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int Symbol_insert(symbol *data,char *key)

{
  s_x2node **ppsVar1;
  s_x2 *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  s_x2node *psVar7;
  s_x2node *psVar8;
  s_x2node *psVar9;
  symbol *psVar10;
  x2node *newnp;
  x2node *oldnp;
  s_x2 array;
  int size;
  int i;
  uint ph;
  uint h;
  x2node *np;
  char *key_local;
  symbol *data_local;
  
  if (x2a == (s_x2 *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    uVar3 = strhash(key);
    for (_ph = x2a->ht[uVar3 & x2a->size - 1U]; _ph != (s_x2node *)0x0; _ph = _ph->next) {
      iVar4 = strcmp(_ph->key,key);
      if (iVar4 == 0) {
        return 0;
      }
    }
    if (x2a->size <= x2a->count) {
      iVar5 = x2a->size * 2;
      iVar4 = x2a->count;
      psVar7 = (s_x2node *)calloc((long)iVar5,0x28);
      if (psVar7 == (s_x2node *)0x0) {
        return 0;
      }
      psVar8 = psVar7 + iVar5;
      for (array.ht._4_4_ = 0; array.ht._4_4_ < iVar5; array.ht._4_4_ = array.ht._4_4_ + 1) {
        (&psVar8->data)[array.ht._4_4_] = (symbol *)0x0;
      }
      for (array.ht._4_4_ = 0; array.ht._4_4_ < x2a->count; array.ht._4_4_ = array.ht._4_4_ + 1) {
        psVar9 = x2a->tbl + array.ht._4_4_;
        uVar6 = strhash(psVar9->key);
        uVar6 = uVar6 & iVar5 - 1U;
        psVar10 = (symbol *)(psVar7 + array.ht._4_4_);
        if ((&psVar8->data)[uVar6] != (symbol *)0x0) {
          (&psVar8->data)[uVar6]->fallback = (symbol *)&psVar10->rule;
        }
        psVar10->rule = (rule *)(&psVar8->data)[uVar6];
        *(char **)&psVar10->index = psVar9->key;
        psVar10->name = (char *)psVar9->data;
        psVar10->fallback = (symbol *)(&psVar8->data + uVar6);
        (&psVar8->data)[uVar6] = psVar10;
      }
      free(x2a->tbl);
      psVar2 = x2a;
      psVar2->size = iVar5;
      psVar2->count = iVar4;
      psVar2->tbl = psVar7;
      psVar2->ht = (s_x2node **)psVar8;
    }
    uVar3 = uVar3 & x2a->size - 1U;
    ppsVar1 = &x2a->tbl;
    iVar4 = x2a->count;
    x2a->count = iVar4 + 1;
    psVar7 = *ppsVar1 + iVar4;
    psVar7->key = key;
    psVar7->data = data;
    if (x2a->ht[uVar3] != (s_x2node *)0x0) {
      x2a->ht[uVar3]->from = &psVar7->next;
    }
    psVar7->next = x2a->ht[uVar3];
    x2a->ht[uVar3] = psVar7;
    psVar7->from = x2a->ht + uVar3;
    data_local._4_4_ = 1;
  }
  return data_local._4_4_;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  unsigned h;
  unsigned ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x2 array;
    array.size = size = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)calloc(size, sizeof(x2node) + sizeof(x2node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}